

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

void __thiscall Darts::Details::BitVector::build(BitVector *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  id_type iVar3;
  size_t sVar4;
  ulong uVar5;
  AutoArray<unsigned_int> *this_00;
  AutoPool<unsigned_int> *pAVar6;
  uint *puVar7;
  AutoPool<unsigned_int> *in_RDI;
  size_t i;
  bad_alloc *anon_var_0;
  undefined4 in_stack_ffffffffffffffa8;
  AutoPool<unsigned_int> *pAVar8;
  AutoPool<unsigned_int> *local_28;
  
  pAVar8 = in_RDI + 1;
  sVar4 = AutoPool<unsigned_int>::size(in_RDI);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar4;
  uVar5 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  this_00 = (AutoArray<unsigned_int> *)operator_new__(uVar5);
  AutoArray<unsigned_int>::reset(this_00,(uint *)pAVar8);
  in_RDI[1].size_ = 0;
  local_28 = (AutoPool<unsigned_int> *)0x0;
  while( true ) {
    pAVar8 = local_28;
    pAVar6 = (AutoPool<unsigned_int> *)AutoPool<unsigned_int>::size(in_RDI);
    if (pAVar6 <= pAVar8) break;
    uVar2 = (uint)in_RDI[1].size_;
    puVar7 = AutoArray<unsigned_int>::operator[]
                       ((AutoArray<unsigned_int> *)(in_RDI + 1),(size_t)local_28);
    *puVar7 = uVar2;
    puVar7 = AutoPool<unsigned_int>::operator[](pAVar8,CONCAT44(uVar2,in_stack_ffffffffffffffa8));
    iVar3 = pop_count(*puVar7);
    in_RDI[1].size_ = (ulong)iVar3 + in_RDI[1].size_;
    local_28 = (AutoPool<unsigned_int> *)((long)&(local_28->buf_).array_ + 1);
  }
  return;
}

Assistant:

inline void BitVector::build() {
  try {
    ranks_.reset(new id_type[units_.size()]);
  } catch (const std::bad_alloc &) {
    DARTS_THROW("failed to build rank index: std::bad_alloc");
  }

  num_ones_ = 0;
  for (std::size_t i = 0; i < units_.size(); ++i) {
    ranks_[i] = num_ones_;
    num_ones_ += pop_count(units_[i]);
  }
}